

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

int tag_label(mdl_t *mdl,FILE *fin,FILE *fout)

{
  long *plVar1;
  undefined8 uVar2;
  _Bool _Var3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  rdr_t *prVar7;
  raw_t rVar8;
  long lVar9;
  FILE *__stream;
  long lVar10;
  mdl_t *pmVar11;
  uint32_t **ppuVar12;
  int iVar13;
  raw_t *prVar14;
  seq_t *psVar15;
  double **ppdVar16;
  double *pdVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint64_t id;
  byte bVar22;
  ulong uVar23;
  size_t sVar24;
  qrk_t *qrk;
  double dVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 uStack_110;
  qrk_t *apqStack_108 [2];
  FILE *local_f8;
  long local_f0;
  raw_t *local_e8;
  size_t local_e0;
  uint64_t local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  mdl_t *local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  ulong local_90;
  double *local_88;
  long local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [16];
  ulong local_58;
  seq_t *local_50;
  long local_48;
  uint32_t **local_40;
  double **local_38;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  
  prVar7 = mdl->reader;
  uVar21 = (ulong)mdl->nlbl;
  uVar19 = (ulong)mdl->opt->nbest;
  lVar9 = -(uVar21 * 0x18 + 0xf & 0xfffffffffffffff0);
  lVar26 = (long)apqStack_108 + lVar9;
  if (uVar21 != 0) {
    uVar23 = 0;
    do {
      *(undefined8 *)(uVar21 * 0x10 + lVar26 + uVar23 * 8) = 0;
      *(undefined8 *)(lVar26 + uVar21 * 8 + uVar23 * 8) = 0;
      *(undefined8 *)(lVar26 + uVar23 * 8) = 0;
      uVar23 = uVar23 + 1;
    } while (uVar21 != uVar23);
  }
  qrk = prVar7->lbl;
  local_f0 = uVar19 * 4;
  local_e0 = uVar19 * 8;
  local_c8 = lVar26 + uVar21 * 8;
  local_c0 = uVar21 * 0x10 + lVar26;
  local_78 = 0;
  local_48 = 0;
  local_80 = 0;
  local_70 = 0;
  apqStack_108[1] = qrk;
  local_f8 = (FILE *)fin;
  local_d8 = uVar21;
  local_d0 = lVar26;
  local_b8 = mdl;
  local_90 = uVar19;
  local_68._0_8_ = fout;
  do {
    __stream = local_f8;
    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107ba8;
    iVar13 = feof(__stream);
    if (iVar13 != 0) goto LAB_00107fd5;
    prVar7 = mdl->reader;
    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107bbd;
    prVar14 = rdr_readraw(prVar7,(FILE *)__stream);
    if (prVar14 == (raw_t *)0x0) {
      iVar13 = 6;
    }
    else {
      prVar7 = mdl->reader;
      _Var3 = mdl->opt->force;
      _Var4 = mdl->opt->check;
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107be9;
      psVar15 = rdr_raw2seq(prVar7,prVar14,(_Bool)(_Var3 | _Var4));
      if (psVar15 == (seq_t *)0x0) {
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107c6d;
        rdr_freeraw(prVar14);
        iVar13 = 1;
      }
      else {
        dVar25 = (double)(ulong)psVar15->len;
        sVar24 = local_f0 * (long)dVar25;
        local_e8 = prVar14;
        local_50 = psVar15;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107c0b;
        local_40 = (uint32_t **)xmalloc(sVar24);
        sVar24 = local_e0 * (long)dVar25;
        local_a8 = dVar25;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107c26;
        ppdVar16 = (double **)xmalloc(sVar24);
        sVar24 = local_e0;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107c35;
        pdVar17 = (double *)xmalloc(sVar24);
        ppuVar12 = local_40;
        psVar15 = local_50;
        local_88 = pdVar17;
        local_38 = ppdVar16;
        if ((uint32_t)uVar19 == 1) {
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107c59;
          tag_viterbi(mdl,psVar15,(uint32_t *)ppuVar12,pdVar17,(double *)ppdVar16);
        }
        else {
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107c8d;
          tag_nbviterbi(mdl,psVar15,(uint32_t)uVar19,ppuVar12,pdVar17,ppdVar16);
        }
        if (uVar19 != 0) {
          local_58 = 0;
          do {
            if (mdl->opt->outsc == true) {
              dVar25 = local_88[local_58];
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107cc9;
              fprintf((FILE *)fout,"# %d %f\n",dVar25);
            }
            if (local_a8 != 0.0) {
              uVar21 = local_58 & 0xffffffff;
              dVar25 = 0.0;
              do {
                uVar2 = local_68._0_8_;
                if (mdl->opt->label == false) {
                  rVar8 = local_e8[(long)dVar25 + 1];
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107d0b;
                  fprintf((FILE *)uVar2,"%s\t",rVar8);
                }
                uVar5 = *(uint *)((long)local_40 + uVar21 * 4);
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107d1e;
                pcVar18 = qrk_id2str(qrk,(ulong)uVar5);
                uVar2 = local_68._0_8_;
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107d30;
                fputs(pcVar18,(FILE *)uVar2);
                if (local_b8->opt->outsc == true) {
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107d57;
                  fprintf((FILE *)uVar2,"\t%s",pcVar18);
                  pdVar17 = local_38[uVar21];
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107d72;
                  fprintf((FILE *)uVar2,"/%f",pdVar17);
                }
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107d7f;
                fputc(10,(FILE *)uVar2);
                dVar25 = (double)((long)dVar25 + 1);
                uVar21 = (ulong)(uint)((int)uVar21 + (int)local_90);
                mdl = local_b8;
                qrk = apqStack_108[1];
                uVar19 = local_90;
              } while (local_a8 != dVar25);
            }
            fout = (FILE *)local_68._0_8_;
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107db8;
            fputc(10,(FILE *)fout);
            local_58 = local_58 + 1;
          } while (local_58 != uVar19);
        }
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107dd4;
        fflush((FILE *)fout);
        ppdVar16 = local_38;
        lVar26 = local_48;
        pdVar17 = local_88;
        if (mdl->opt->check == true) {
          if (local_a8 == 0.0) {
            uVar19 = 0;
          }
          else {
            lVar20 = 0;
            uVar21 = 0;
            bVar22 = 0;
            do {
              uVar5 = *(uint *)((long)&local_50[1].len + lVar20);
              if ((ulong)uVar5 != 0xffffffff) {
                plVar1 = (long *)(local_d0 + (ulong)uVar5 * 8);
                *plVar1 = *plVar1 + 1;
                uVar6 = *(uint *)((long)local_40 + uVar21 * 4);
                plVar1 = (long *)(local_c8 + (ulong)uVar6 * 8);
                *plVar1 = *plVar1 + 1;
                if (uVar5 == uVar6) {
                  plVar1 = (long *)(local_c0 + (ulong)uVar6 * 8);
                  *plVar1 = *plVar1 + 1;
                }
                else {
                  local_80 = local_80 + 1;
                  bVar22 = 1;
                }
              }
              uVar21 = (ulong)(uint)((int)uVar21 + (int)uVar19);
              lVar20 = lVar20 + 0x20;
            } while ((long)local_a8 << 5 != lVar20);
            uVar19 = (ulong)bVar22;
          }
          local_70 = local_70 + (long)local_a8;
          local_78 = local_78 + uVar19;
        }
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107e9d;
        free(pdVar17);
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107ea5;
        free(ppdVar16);
        ppuVar12 = local_40;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107eae;
        free(ppuVar12);
        psVar15 = local_50;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107eb7;
        rdr_freeseq(psVar15);
        prVar14 = local_e8;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107ec3;
        rdr_freeraw(prVar14);
        lVar26 = lVar26 + 1;
        local_48 = lVar26;
        if (((ulong)(lVar26 * 0x1cac083126e978d5) >> 3 | lVar26 * 0x1cac083126e978d5 << 0x3d) <
            0x4189374bc6a7f0) {
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107f05;
          info("%10lu sequences labeled",lVar26);
          if (mdl->opt->check == true) {
            auVar33._8_4_ = (int)((ulong)local_80 >> 0x20);
            auVar33._0_8_ = local_80;
            auVar33._12_4_ = 0x45300000;
            uVar31 = (undefined4)local_80;
            auVar34._8_4_ = (int)((ulong)local_70 >> 0x20);
            auVar34._0_8_ = local_70;
            auVar34._12_4_ = 0x45300000;
            uVar32 = (undefined4)local_70;
            auVar36._8_4_ = (int)((ulong)local_78 >> 0x20);
            auVar36._0_8_ = local_78;
            auVar36._12_4_ = 0x45300000;
            uVar35 = (undefined4)local_78;
            auVar37._8_4_ = (int)((ulong)lVar26 >> 0x20);
            auVar37._0_8_ = lVar26;
            auVar37._12_4_ = 0x45300000;
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107fad;
            info("\t%5.2f%%/%5.2f%%",
                 (((auVar33._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,uVar31) - 4503599627370496.0)) /
                 ((auVar34._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar32) - 4503599627370496.0))) * 100.0,
                 (((auVar36._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,uVar35) - 4503599627370496.0)) /
                 ((auVar37._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar26) - 4503599627370496.0))) * 100.0);
          }
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x107fbd;
          info("\n");
        }
        iVar13 = 0;
        uVar19 = local_90;
      }
    }
  } while (iVar13 == 0);
  if (iVar13 == 6) {
LAB_00107fd5:
    iVar13 = 1;
    if (mdl->opt->check == true) {
      auVar27._8_4_ = (int)((ulong)local_80 >> 0x20);
      auVar27._0_8_ = local_80;
      auVar27._12_4_ = 0x45300000;
      dStack_b0 = auVar27._8_8_ - 1.9342813113834067e+25;
      auVar28._8_4_ = (int)((ulong)local_70 >> 0x20);
      auVar28._0_8_ = local_70;
      auVar28._12_4_ = 0x45300000;
      local_b8 = (mdl_t *)(((dStack_b0 +
                            ((double)CONCAT44(0x43300000,(int)local_80) - 4503599627370496.0)) /
                           ((auVar28._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_70) - 4503599627370496.0))) *
                          100.0);
      auVar29._8_4_ = (int)((ulong)local_78 >> 0x20);
      auVar29._0_8_ = local_78;
      auVar29._12_4_ = 0x45300000;
      local_68._8_8_ = auVar29._8_8_ - 1.9342813113834067e+25;
      auVar30._8_4_ = (int)((ulong)local_48 >> 0x20);
      auVar30._0_8_ = local_48;
      auVar30._12_4_ = 0x45300000;
      local_68._0_8_ =
           (((double)local_68._8_8_ +
            ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0)) /
           ((auVar30._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0))) * 100.0;
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x108093;
      info("    Nb sequences  : %lu\n");
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1080a8;
      info("    Token error   : %5.2f%%\n");
      uVar2 = local_68._0_8_;
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1080bb;
      info("    Sequence error: %5.2f%%\n",uVar2);
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1080c9;
      info("* Per label statistics\n");
      lVar10 = local_c0;
      lVar20 = local_c8;
      lVar26 = local_d0;
      if (local_d8 != 0) {
        id = 0;
        do {
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1080f9;
          pcVar18 = qrk_id2str(qrk,id);
          uVar2 = *(undefined8 *)(lVar10 + id * 8);
          auVar39._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
          auVar39._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar39._12_4_ = 0x45300000;
          dVar25 = auVar39._8_8_ - 1.9342813113834067e+25;
          uVar19 = *(ulong *)(lVar20 + id * 8);
          uVar21 = *(ulong *)(lVar26 + id * 8);
          auVar38._0_8_ =
               ((double)(uVar21 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar21 & 0xffffffff | 0x4330000000000000);
          auVar38._8_8_ =
               ((double)(uVar19 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar19 & 0xffffffff | 0x4330000000000000);
          auVar40._0_8_ = (auVar39._0_8_ - 4503599627370496.0) + dVar25;
          auVar40._8_8_ = (auVar39._0_8_ - 4503599627370496.0) + dVar25;
          local_68 = divpd(auVar40,auVar38);
          dStack_b0 = local_68._8_8_;
          dVar25 = local_68._0_8_ * dStack_b0;
          local_b8 = (mdl_t *)((dVar25 + dVar25) / (dStack_b0 + local_68._0_8_));
          local_a8 = dStack_b0;
          dStack_a0 = dStack_b0;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1081a1;
          info("    %-6s",pcVar18);
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1081b6;
          info("  Pr=%.2f");
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1081c8;
          info("  Rc=%.2f");
          pmVar11 = local_b8;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x1081de;
          info("  F1=%.2f\n",pmVar11);
          id = id + 1;
        } while (id != local_d8);
        iVar13 = 1;
      }
    }
  }
  else {
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int tag_label(mdl_t *mdl, FILE *fin, FILE *fout) {
	qrk_t *lbls = mdl->reader->lbl;
	const uint32_t Y = mdl->nlbl;
	const uint32_t N = mdl->opt->nbest;
	// We start by preparing the statistic collection to be ready if check
	// option is used. The stat array hold the following for each label
	//   [0] # of reference with this label
	//   [1] # of token we have taged with this label
	//   [2] # of match of the two preceding
	uint64_t tcnt = 0, terr = 0;
	uint64_t scnt = 0, serr = 0;
	uint64_t stat[3][Y];
	for (uint32_t y = 0; y < Y; y++)
		stat[0][y] = stat[1][y] = stat[2][y] = 0;
	// Next read the input file sequence by sequence and label them, we have
	// to take care of not discarding the raw input as we want to send it
	// back to the output with the additional predicted labels.
	while (!feof(fin)) {
		// So, first read an input sequence keeping the raw_t object
		// available, and label it with Viterbi.
		raw_t *raw = rdr_readraw(mdl->reader, fin);
		if (raw == NULL)
			break;
		seq_t *seq = rdr_raw2seq(mdl->reader, raw,
			mdl->opt->check | mdl->opt->force);
        if (seq == NULL) {
            rdr_freeraw(raw);
            return 0;
        }
		const uint32_t T = seq->len;
		uint32_t *out = xmalloc(sizeof(uint32_t) * T * N);
		double   *psc = xmalloc(sizeof(double  ) * T * N);
		double   *scs = xmalloc(sizeof(double  ) * N);
		if (N == 1)
			tag_viterbi(mdl, seq, (uint32_t*)out, scs, (double*)psc);
		else
			tag_nbviterbi(mdl, seq, N, (void*)out, scs, (void*)psc);
		// Next we output the raw sequence with an aditional column for
		// the predicted labels
		for (uint32_t n = 0; n < N; n++) {
			if (mdl->opt->outsc)
				fprintf(fout, "# %d %f\n", (int)n, scs[n]);
			for (uint32_t t = 0; t < T; t++) {
				if (!mdl->opt->label)
					fprintf(fout, "%s\t", raw->lines[t]);
				uint32_t lbl = out[t * N + n];
				const char *lblstr = qrk_id2str(lbls, lbl);
				fprintf(fout, "%s", lblstr);
				if (mdl->opt->outsc) {
					fprintf(fout, "\t%s", lblstr);
					fprintf(fout, "/%f", psc[t * N + n]);
				}
				fprintf(fout, "\n");
			}
			fprintf(fout, "\n");
		}
		fflush(fout);
		// If user provided reference labels, use them to collect
		// statistics about how well we have performed here. Labels
		// unseen at training time are discarded.
		if (mdl->opt->check) {
			bool err = false;
			for (uint32_t t = 0; t < T; t++) {
				if (seq->pos[t].lbl == (uint32_t)-1)
					continue;
				stat[0][seq->pos[t].lbl]++;
				stat[1][out[t * N]]++;
				if (seq->pos[t].lbl != out[t * N])
					terr++, err = true;
				else
					stat[2][out[t * N]]++;
			}
			tcnt += T;
			serr += err;
		}
		// Cleanup memory used for this sequence
		free(scs);
		free(psc);
		free(out);
		rdr_freeseq(seq);
		rdr_freeraw(raw);
		// And report our progress, at regular interval we display how
		// much sequence are labelled and if possible the current tokens
		// and sequence error rates.
		if (++scnt % 1000 == 0) {
			info("%10"PRIu64" sequences labeled", scnt);
			if (mdl->opt->check) {
				const double te = (double)terr  / tcnt * 100.0;
				const double se = (double)serr  / scnt * 100.0;
				info("\t%5.2f%%/%5.2f%%", te, se);
			}
			info("\n");
		}
	}
	// If user have provided reference labels, we have collected a lot of
	// statistics and we can repport global token and sequence error rate as
	// well as precision recall and f-measure for each labels.
	if (mdl->opt->check) {
		const double te = (double)terr  / tcnt * 100.0;
		const double se = (double)serr  / scnt * 100.0;
		info("    Nb sequences  : %"PRIu64"\n", scnt);
		info("    Token error   : %5.2f%%\n", te);
		info("    Sequence error: %5.2f%%\n", se);
		info("* Per label statistics\n");
		for (uint32_t y = 0; y < Y; y++) {
			const char   *lbl = qrk_id2str(lbls, y);
			const double  Rc  = (double)stat[2][y] / stat[0][y];
			const double  Pr  = (double)stat[2][y] / stat[1][y];
			const double  F1  = 2.0 * (Pr * Rc) / (Pr + Rc);
			info("    %-6s", lbl);
			info("  Pr=%.2f", Pr);
			info("  Rc=%.2f", Rc);
			info("  F1=%.2f\n", F1);
		}
	}
    
    return 1;
}